

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall CharConvByte::putch(CharConvByte *this,char **buf,wchar_t ch,int idx,int pct)

{
  undefined1 *puVar1;
  uint in_EDX;
  long *in_RSI;
  int in_R8D;
  uint local_14;
  
  local_14 = in_EDX;
  if (0xff < (int)in_EDX) {
    if (in_R8D == 0) {
      err_throw(0);
    }
    local_14 = in_EDX & 0xff;
  }
  puVar1 = (undefined1 *)*in_RSI;
  *in_RSI = (long)(puVar1 + 1);
  *puVar1 = (char)local_14;
  return;
}

Assistant:

virtual void putch(char *&buf, wchar_t ch, int idx, int pct)
    {
        /* raw bytes - make sure the byte is in range */
        if (ch > 255)
        {
            /* % modifier -> truncate to byte, otherwise it's an error */
            if (pct)
                ch &= 0xff;
            else
                err_throw(VMERR_NUM_OVERFLOW);
        }

        /* store it */
        *buf++ = (char)ch;
    }